

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall FIX::DoubleField::DoubleField(DoubleField *this,int field,double data,int padding)

{
  int in_ECX;
  string sStack_38;
  
  DoubleConvertor::convert_abi_cxx11_
            (&sStack_38,(DoubleConvertor *)(ulong)(uint)padding,data,0xf,in_ECX);
  FieldBase::FieldBase(&this->super_FieldBase,field,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00150de8;
  return;
}

Assistant:

explicit DoubleField(int field, double data, int padding = 0)
      : FieldBase(field, DoubleConvertor::convert(data, padding)) {}